

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O3

char * timestamp_to_db_string(uint8_t *timestamp,char *string_buf,size_t string_buf_len)

{
  snprintf(string_buf,string_buf_len,"%04d%02d%02d,%02d%02d%02d",(ulong)(*timestamp + 0x76c),
           (ulong)timestamp[1],(ulong)timestamp[2],(ulong)timestamp[3],(ulong)timestamp[4],
           (ulong)timestamp[5]);
  return string_buf;
}

Assistant:

char* timestamp_to_db_string(uint8_t *timestamp, char *string_buf, size_t string_buf_len) {
    snprintf(string_buf, string_buf_len, "%04d%02d%02d,%02d%02d%02d",
             timestamp[0] + 1900,
             timestamp[1],
             timestamp[2],
             timestamp[3],
             timestamp[4],
             timestamp[5]);

    return string_buf;
}